

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relivedb.cpp
# Opt level: O0

Storage * storage_abi_cxx11_(void)

{
  int iVar1;
  string *in_stack_000026e8;
  undefined4 in_stack_ffffffffffffff64;
  undefined8 in_stack_ffffffffffffff68;
  path *in_stack_ffffffffffffff70;
  string_type local_80;
  path local_60;
  path local_40;
  string local_20;
  
  if (storage[abi:cxx11]()::_storage_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&storage[abi:cxx11]()::_storage_abi_cxx11_);
    if (iVar1 != 0) {
      relive::dataPath_abi_cxx11_();
      ghc::filesystem::path::path(&local_60,&local_80,auto_format);
      ghc::filesystem::path::path<char[14],ghc::filesystem::path>
                (in_stack_ffffffffffffff70,(char (*) [14])in_stack_ffffffffffffff68,
                 in_stack_ffffffffffffff64);
      ghc::filesystem::operator/(&local_40,&local_60,(path *)&stack0xffffffffffffff50);
      ghc::filesystem::path::string_abi_cxx11_(&local_20,&local_40);
      initStorage(in_stack_000026e8);
      std::__cxx11::string::~string((string *)&local_20);
      ghc::filesystem::path::~path(&local_40);
      ghc::filesystem::path::~path((path *)&stack0xffffffffffffff50);
      ghc::filesystem::path::~path(&local_60);
      std::__cxx11::string::~string((string *)&local_80);
      __cxa_atexit(sqlite_orm::internal::storage_t<$86c824a$>::~storage_t,
                   &storage[abi:cxx11]()::_storage_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&storage[abi:cxx11]()::_storage_abi_cxx11_);
    }
  }
  return &storage[abi:cxx11]()::_storage_abi_cxx11_;
}

Assistant:

static Storage& storage()
{
    static Storage _storage = initStorage((fs::path(dataPath()) / "relive.sqlite").string());
    return _storage;
}